

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr)

{
  Vdbe *p;
  int iVar1;
  Expr *pEVar2;
  int iVar3;
  char *pcVar4;
  int local_6c;
  Vdbe *v;
  Expr *pLimit;
  undefined1 local_50 [4];
  int nReg;
  SelectDest dest;
  Select *pSel;
  int rReg;
  int addrOnce;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pSel._4_4_ = 0;
  p = pParse->pVdbe;
  dest.pOrderBy = (pExpr->x).pList;
  if ((pExpr->flags & 0x20) == 0) {
    if ((pExpr->flags & 0x2000000) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE SUBQUERY %d",
                         (ulong)*(uint *)&(dest.pOrderBy)->a[0].zSpan);
      sqlite3VdbeAddOp2(p,0xc,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr);
      return pExpr->iTable;
    }
    pExpr->flags = pExpr->flags | 0x2000000;
    iVar3 = pParse->nMem + 1;
    pParse->nMem = iVar3;
    (pExpr->y).sub.regReturn = iVar3;
    iVar3 = sqlite3VdbeAddOp2(p,0x46,0,(pExpr->y).sub.regReturn);
    (pExpr->y).sub.iAddr = iVar3 + 1;
    pSel._4_4_ = sqlite3VdbeAddOp0(p,0x11);
  }
  pcVar4 = "CORRELATED ";
  if (pSel._4_4_ != 0) {
    pcVar4 = "";
  }
  sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY %d",pcVar4,
                     (ulong)*(uint *)&(dest.pOrderBy)->a[0].zSpan);
  if (pExpr->op == 0x83) {
    local_6c = **(int **)dest.pOrderBy;
  }
  else {
    local_6c = 1;
  }
  sqlite3SelectDestInit((SelectDest *)local_50,0,pParse->nMem + 1);
  pParse->nMem = local_6c + pParse->nMem;
  if (pExpr->op == 0x83) {
    local_50[0] = '\n';
    dest._0_4_ = nReg;
    dest.iSDParm = local_6c;
    sqlite3VdbeAddOp3(p,0x49,0,nReg,nReg + local_6c + -1);
  }
  else {
    local_50[0] = '\x03';
    sqlite3VdbeAddOp2(p,0x46,0,nReg);
  }
  pEVar2 = sqlite3ExprAlloc(pParse->db,0x93,sqlite3IntTokens + 1,0);
  if (dest.pOrderBy[2].a[0].zName == (char *)0x0) {
    pEVar2 = sqlite3PExpr(pParse,0x8d,pEVar2,(Expr *)0x0);
    dest.pOrderBy[2].a[0].zName = (char *)pEVar2;
  }
  else {
    sqlite3ExprDelete(pParse->db,*(Expr **)(dest.pOrderBy[2].a[0].zName + 0x10));
    *(Expr **)(dest.pOrderBy[2].a[0].zName + 0x10) = pEVar2;
  }
  *(undefined4 *)&(dest.pOrderBy)->a[0].zName = 0;
  iVar3 = sqlite3Select(pParse,(Select *)dest.pOrderBy,(SelectDest *)local_50);
  if (iVar3 == 0) {
    pExpr->iTable = nReg;
    if (pSel._4_4_ != 0) {
      sqlite3VdbeJumpHere(p,pSel._4_4_);
      sqlite3VdbeAddOp1(p,0x42,(pExpr->y).sub.regReturn);
      iVar3 = (pExpr->y).sub.iAddr;
      iVar1 = sqlite3VdbeCurrentAddr(p);
      sqlite3VdbeChangeP1(p,iVar3 - 1,iVar1 + -1);
    }
    pParse_local._4_4_ = nReg;
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(Parse *pParse, Expr *pExpr){
  int addrOnce = 0;           /* Address of OP_Once at top of subroutine */
  int rReg = 0;               /* Register storing resulting */
  Select *pSel;               /* SELECT statement to encode */
  SelectDest dest;            /* How to deal with SELECT result */
  int nReg;                   /* Registers to allocate */
  Expr *pLimit;               /* New limit expression */

  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  testcase( pExpr->op==TK_EXISTS );
  testcase( pExpr->op==TK_SELECT );
  assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
  assert( ExprHasProperty(pExpr, EP_xIsSelect) );
  pSel = pExpr->x.pSelect;

  /* The evaluation of the EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    /* If this routine has already been coded, then invoke it as a
    ** subroutine. */
    if( ExprHasProperty(pExpr, EP_Subrtn) ){
      ExplainQueryPlan((pParse, 0, "REUSE SUBQUERY %d", pSel->selId));
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      return pExpr->iTable;
    }

    /* Begin coding the subroutine */
    ExprSetProperty(pExpr, EP_Subrtn);
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pExpr->y.sub.regReturn) + 1;
    VdbeComment((v, "return address"));

    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }
  
  /* For a SELECT, generate code to put the values for all columns of
  ** the first row into an array of registers and return the index of
  ** the first register.
  **
  ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
  ** into a register and return that register number.
  **
  ** In both cases, the query is augmented with "LIMIT 1".  Any 
  ** preexisting limit is discarded in place of the new LIMIT 1.
  */
  ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSel->selId));
  nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
  sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
  pParse->nMem += nReg;
  if( pExpr->op==TK_SELECT ){
    dest.eDest = SRT_Mem;
    dest.iSdst = dest.iSDParm;
    dest.nSdst = nReg;
    sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
    VdbeComment((v, "Init subquery result"));
  }else{
    dest.eDest = SRT_Exists;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
    VdbeComment((v, "Init EXISTS result"));
  }
  pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
  if( pSel->pLimit ){
    sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
    pSel->pLimit->pLeft = pLimit;
  }else{
    pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
  }
  pSel->iLimit = 0;
  if( sqlite3Select(pParse, pSel, &dest) ){
    return 0;
  }
  pExpr->iTable = rReg = dest.iSDParm;
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  if( addrOnce ){
    sqlite3VdbeJumpHere(v, addrOnce);

    /* Subroutine return */
    sqlite3VdbeAddOp1(v, OP_Return, pExpr->y.sub.regReturn);
    sqlite3VdbeChangeP1(v, pExpr->y.sub.iAddr-1, sqlite3VdbeCurrentAddr(v)-1);
  }

  return rReg;
}